

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

integer_t tchecker::refdbm::constrain_to_single_valuation(db_t *rdbm,reference_clock_variables_t *r)

{
  clock_id_t x_00;
  bool bVar1;
  uint uVar2;
  clock_id_t cVar3;
  int iVar4;
  integer_t iVar5;
  ineq_cmp_t iVar6;
  integer_t iVar7;
  size_t sVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  overflow_error *poVar9;
  const_reference pvVar10;
  integer_t v_1;
  clock_id_t rx;
  integer_t v;
  integer_t max_v_0x;
  integer_t max_v_x0;
  uint local_34;
  clock_id_t x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *refmap;
  clock_id_t refcount;
  clock_id_t rdim;
  integer_t factor;
  reference_clock_variables_t *r_local;
  db_t *rdbm_local;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3bd,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_consistent(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3be,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_tight(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3bf,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  refcount = 1;
  sVar8 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)r);
  uVar2 = (uint)sVar8;
  cVar3 = reference_clock_variables_t::refcount(r);
  this = reference_clock_variables_t::refmap(r);
  for (local_34 = 1; local_34 < uVar2; local_34 = local_34 + 1) {
    bVar1 = has_fixed_value(rdbm,r,local_34);
    if (!bVar1) {
      bVar1 = admits_integer_value(rdbm,r,local_34);
      if (!bVar1) {
        iVar4 = std::numeric_limits<int>::max();
        if (iVar4 / 2 < (int)refcount) {
          poVar9 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error
                    (poVar9,"tchecker::refdbm::constrain_to_single_valuation: scale factor overflow"
                    );
          __cxa_throw(poVar9,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        refcount = refcount << 1;
        scale_up(rdbm,r,refcount);
      }
      if (local_34 < cVar3) {
        iVar5 = tchecker::dbm::value(rdbm + local_34 * uVar2);
        iVar6 = tchecker::dbm::comparator(rdbm + local_34 * uVar2);
        iVar5 = iVar5 - (uint)(iVar6 != LE);
        iVar7 = tchecker::dbm::value(rdbm + local_34);
        iVar6 = tchecker::dbm::comparator(rdbm + local_34);
        iVar4 = iVar7 - (uint)(iVar6 != LE);
        if (iVar5 < -iVar4) {
          __assert_fail("-max_v_0x <= max_v_x0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                        ,0x3dc,
                        "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                       );
        }
        v_1 = 0;
        if ((-1 < iVar5) && (iVar5 = v_1, iVar4 < 0)) {
          iVar5 = -iVar4;
        }
        v_1 = iVar5;
        constrain(rdbm,r,local_34,0,LE,v_1);
        constrain(rdbm,r,0,local_34,LE,-v_1);
      }
      else {
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (this,(ulong)local_34);
        x_00 = *pvVar10;
        iVar5 = tchecker::dbm::value(rdbm + (x_00 * uVar2 + local_34));
        if (iVar5 < -0x3fffffff) {
          poVar9 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error
                    (poVar9,
                     "tchecker::refdbm::constrain_to_single_valuation: integer value overflow");
          __cxa_throw(poVar9,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        iVar5 = tchecker::dbm::value(rdbm + (x_00 * uVar2 + local_34));
        iVar6 = tchecker::dbm::comparator(rdbm + (x_00 * uVar2 + local_34));
        iVar4 = (uint)(iVar6 != LE) - iVar5;
        constrain(rdbm,r,x_00,local_34,LE,-iVar4);
        constrain(rdbm,r,local_34,x_00,LE,iVar4);
      }
    }
  }
  bVar1 = is_consistent(rdbm,r);
  if (bVar1) {
    bVar1 = is_tight(rdbm,r);
    if (!bVar1) {
      __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                    ,0x3f5,
                    "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                   );
    }
    return refcount;
  }
  __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0x3f4,
                "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
               );
}

Assistant:

tchecker::integer_t constrain_to_single_valuation(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  tchecker::integer_t factor = 1;

  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const refcount = r.refcount();
  std::vector<tchecker::clock_id_t> const & refmap = r.refmap();
  for (tchecker::clock_id_t x = 1; x < rdim; ++x) {
    // find clock which has not fixed value yet
    if (tchecker::refdbm::has_fixed_value(rdbm, r, x))
      continue;

    // if selected clock does not admit integer value, scale dbm up
    if (!tchecker::refdbm::admits_integer_value(rdbm, r, x)) {
      if (factor > std::numeric_limits<tchecker::integer_t>::max() / 2)
        throw std::overflow_error("tchecker::refdbm::constrain_to_single_valuation: scale factor overflow");
      factor *= 2;
      tchecker::refdbm::scale_up(rdbm, r, factor);
    }

    // if x is a reference clock, then choose integer value w.r.t. first reference clock (i.e. 0)
    if (x < refcount) {
      // x-0<vx0 && 0-x<v0x
      // <=> -v0x < x-0 < vx0
      // then, choose smallest absolute value v within [-v0x,vx0], and set x-0 == v
      tchecker::integer_t const max_v_x0 =
          tchecker::dbm::value(RDBM(x, 0)) - (tchecker::dbm::comparator(RDBM(x, 0)) == tchecker::LE ? 0 : 1);
      tchecker::integer_t const max_v_0x =
          tchecker::dbm::value(RDBM(0, x)) - (tchecker::dbm::comparator(RDBM(0, x)) == tchecker::LE ? 0 : 1);
      assert(-max_v_0x <= max_v_x0);
      // choose smallest absolute value v between -max_v_0x and max_v_x0
      tchecker::integer_t v = 0;
      if (max_v_x0 < 0)
        v = max_v_x0;
      else if (-max_v_0x > 0)
        v = -max_v_0x;
      tchecker::refdbm::constrain(rdbm, r, x, 0, tchecker::LE, v);
      tchecker::refdbm::constrain(rdbm, r, 0, x, tchecker::LE, -v);
    }
    else {
      // otherwise, choose integer value w.r.t. reference clock (using rx<=x)
      tchecker::clock_id_t const rx = refmap[x];

      if (tchecker::dbm::value(RDBM(rx, x)) <= tchecker::dbm::MIN_VALUE)
        throw std::overflow_error("tchecker::refdbm::constrain_to_single_valuation: integer value overflow");

      tchecker::integer_t v =
          -tchecker::dbm::value(RDBM(rx, x)) + (tchecker::dbm::comparator(RDBM(rx, x)) == tchecker::LE ? 0 : 1);
      tchecker::refdbm::constrain(rdbm, r, rx, x, tchecker::LE, -v);
      tchecker::refdbm::constrain(rdbm, r, x, rx, tchecker::LE, v);
    }
  }

  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  return factor;
}